

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.h
# Opt level: O2

int32_t bcf_dec_int1(uint8_t *p,int type,uint8_t **q)

{
  if (type == 2) {
    *q = p + 2;
    return (int)*(short *)p;
  }
  if (type == 1) {
    *q = p + 1;
    return (int)(char)*p;
  }
  *q = p + 4;
  return *(int32_t *)p;
}

Assistant:

static inline int32_t bcf_dec_int1(const uint8_t *p, int type, uint8_t **q)
{
    if (type == BCF_BT_INT8) {
        *q = (uint8_t*)p + 1;
        return *(int8_t*)p;
    } else if (type == BCF_BT_INT16) {
        *q = (uint8_t*)p + 2;
        return *(int16_t*)p;
    } else {
        *q = (uint8_t*)p + 4;
        return *(int32_t*)p;
    }
}